

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O0

Pointer __thiscall
dg::pta::LLVMPointerGraphBuilder::getConstantExprPointer
          (LLVMPointerGraphBuilder *this,ConstantExpr *CE)

{
  uint uVar1;
  LLVMPointerGraphBuilder *this_00;
  Pointer *Str;
  Instruction *in_RSI;
  Value *in_RDI;
  Pointer PVar2;
  LLVMPointerGraphBuilder *unaff_retaddr;
  Instruction *Inst;
  Pointer pointer;
  PSNode *n;
  Pointer *in_stack_ffffffffffffff70;
  CastInst *local_80;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffff90;
  Instruction *local_50;
  undefined1 in_stack_ffffffffffffffc0 [16];
  GetElementPtrInst *GEP;
  Offset local_28;
  Instruction *local_20;
  PSNode *local_10;
  Offset in_stack_fffffffffffffff8;
  
  n = UNKNOWN_MEMORY;
  local_20 = in_RSI;
  Offset::Offset(&local_28,Offset::UNKNOWN);
  Pointer::Pointer((Pointer *)&local_10,n,local_28);
  this_00 = (LLVMPointerGraphBuilder *)llvm::ConstantExpr::getAsInstruction(local_20);
  uVar1 = llvm::Instruction::getOpcode((Instruction *)0x1b6563);
  GEP = in_stack_ffffffffffffffc0._8_8_;
  Str = (Pointer *)(ulong)(uVar1 - 0xd);
  switch(Str) {
  case (Pointer *)0x0:
    handleConstantAdd(unaff_retaddr,(Instruction *)in_stack_fffffffffffffff8.offset);
    Pointer::operator=(in_stack_ffffffffffffff70,Str);
    break;
  default:
    llvm::errs();
    llvm::raw_ostream::operator<<((raw_ostream *)in_stack_ffffffffffffff70,(char *)Str);
    llvm::operator<<((raw_ostream *)n,in_RDI);
    llvm::raw_ostream::operator<<((raw_ostream *)in_stack_ffffffffffffff70,(char *)Str);
    abort();
  case (Pointer *)0x2:
  case (Pointer *)0x4:
  case (Pointer *)0x7:
    PVar2 = handleConstantArithmetic(in_stack_ffffffffffffffc0._0_8_,local_50);
    Pointer::operator=((Pointer *)PVar2.target,Str);
    break;
  case (Pointer *)0xc:
  case (Pointer *)0xd:
  case (Pointer *)0xe:
  case (Pointer *)0xf:
  case (Pointer *)0x10:
  case (Pointer *)0x19:
    Pointer::operator=(in_stack_ffffffffffffff70,Str);
    break;
  case (Pointer *)0x15:
    llvm::cast<llvm::GetElementPtrInst,llvm::Instruction>((Instruction *)0x1b6595);
    handleConstantGep(this_00,GEP);
    Pointer::operator=(in_stack_ffffffffffffff70,Str);
    break;
  case (Pointer *)0x1a:
  case (Pointer *)0x1b:
  case (Pointer *)0x24:
    llvm::cast<llvm::CastInst,llvm::Instruction>((Instruction *)0x1b65cc);
    handleConstantBitCast(in_stack_ffffffffffffff90,local_80);
    Pointer::operator=(in_stack_ffffffffffffff70,Str);
    break;
  case (Pointer *)0x22:
    llvm::cast<llvm::PtrToIntInst,llvm::Instruction>((Instruction *)0x1b6603);
    handleConstantPtrToInt(in_stack_ffffffffffffff90,(PtrToIntInst *)local_80);
    Pointer::operator=(in_stack_ffffffffffffff70,Str);
    break;
  case (Pointer *)0x23:
    llvm::cast<llvm::IntToPtrInst,llvm::Instruction>((Instruction *)0x1b663a);
    handleConstantIntToPtr(in_stack_ffffffffffffff90,(IntToPtrInst *)local_80);
    Pointer::operator=(in_stack_ffffffffffffff70,Str);
  }
  llvm::Value::deleteValue();
  PVar2.offset.offset = in_stack_fffffffffffffff8.offset;
  PVar2.target = local_10;
  return PVar2;
}

Assistant:

Pointer
LLVMPointerGraphBuilder::getConstantExprPointer(const llvm::ConstantExpr *CE) {
    using namespace llvm;

    Pointer pointer(UNKNOWN_MEMORY, Offset::UNKNOWN);
    Instruction *Inst = const_cast<ConstantExpr *>(CE)->getAsInstruction();

    switch (Inst->getOpcode()) {
    case Instruction::GetElementPtr:
        pointer = handleConstantGep(cast<GetElementPtrInst>(Inst));
        break;
        // case Instruction::ExtractValue:
        // case Instruction::Select:
        break;
    case Instruction::BitCast:
    case Instruction::SExt:
    case Instruction::ZExt:
        pointer = handleConstantBitCast(cast<CastInst>(Inst));
        break;
    case Instruction::PtrToInt:
        pointer = handleConstantPtrToInt(cast<PtrToIntInst>(Inst));
        break;
    case Instruction::IntToPtr:
        pointer = handleConstantIntToPtr(cast<IntToPtrInst>(Inst));
        break;
    case Instruction::Add:
        pointer = handleConstantAdd(Inst);
        break;
    case Instruction::And:
    case Instruction::Or:
    case Instruction::Trunc:
    case Instruction::Shl:
    case Instruction::LShr:
    case Instruction::AShr:
        pointer = UnknownPointer;
        break;
    case Instruction::Sub:
    case Instruction::Mul:
    case Instruction::SDiv:
        pointer = handleConstantArithmetic(Inst);
        break;
    default:
        errs() << "ERR: Unsupported ConstantExpr " << *CE << "\n";
        abort();
    }

#if LLVM_VERSION_MAJOR < 5
    delete Inst;
#else
    Inst->deleteValue();
#endif
    return pointer;
}